

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

_Bool sysbvm_environment_lookSymbolRecursively
                (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t symbol,
                sysbvm_tuple_t *outBinding)

{
  _Bool _Var1;
  
  *outBinding = 0;
  if ((environment & 0xf) == 0 && environment != 0) {
    while ((*(sysbvm_tuple_t *)(environment + 0x40) == 0 ||
           (_Var1 = sysbvm_identityDictionary_findAssociation
                              (*(sysbvm_tuple_t *)(environment + 0x40),symbol,outBinding), !_Var1)))
    {
      environment = *(ulong *)(environment + 0x30);
      *outBinding = 0;
      if (environment == 0) {
        return false;
      }
      if ((environment & 0xf) != 0) {
        return false;
      }
    }
    _Var1 = true;
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

SYSBVM_API bool sysbvm_environment_lookSymbolRecursively(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t symbol, sysbvm_tuple_t *outBinding)
{
    *outBinding = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_isNonNullPointer(environment))
        return false;

    sysbvm_environment_t *environmentObject = (sysbvm_environment_t*)environment;
    if(environmentObject->symbolTable && sysbvm_identityDictionary_findAssociation(environmentObject->symbolTable, symbol, outBinding))
        return true;

    return sysbvm_environment_lookSymbolRecursively(context, environmentObject->parent, symbol, outBinding);
}